

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> * __thiscall
dg::pta::PointerSubgraph::getLoop(PointerSubgraph *this,PSNode *nd)

{
  const_iterator cVar1;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar2;
  PSNode *local_10;
  
  local_10 = nd;
  cVar1 = std::
          _Hashtable<const_dg::pta::PSNode_*,_std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::pta::PSNode_*>,_std::hash<const_dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_dg::pta::PSNode_*,_std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_std::allocator<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::pta::PSNode_*>,_std::hash<const_dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x20),&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false>
      ._M_cur == (__node_type *)0x0) {
    pvVar2 = (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x0;
  }
  else {
    pvVar2 = (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
             (*(long *)((long)cVar1.
                              super__Node_iterator_base<std::pair<const_dg::pta::PSNode_*const,_unsigned_long>,_false>
                              ._M_cur + 0x10) * 0x18 + *(long *)(this + 8));
  }
  return pvVar2;
}

Assistant:

const std::vector<PSNode *> *getLoop(const PSNode *nd) const {
        assert(_computed_loops && "Call computeLoops() first");

        auto it = _node_to_loop.find(nd);
        assert(it == _node_to_loop.end() || it->second < _loops.size());
        return it == _node_to_loop.end() ? nullptr : &_loops[it->second];
    }